

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O1

void __thiscall
kj::Canceler::AdapterImpl<capnp::Capability::Client>::cancel
          (AdapterImpl<capnp::Capability::Client> *this,Exception *e)

{
  PromiseArenaMember *node;
  
  (**(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector)();
  node = &((this->inner).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  (this->inner).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
    return;
  }
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }